

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeLockTable(Btree *p,int iTab,u8 isWriteLock)

{
  int *piVar1;
  BtShared *pBVar2;
  int iVar3;
  BtLock *pBVar4;
  byte eLock;
  
  if (p->sharable == '\0') {
    iVar3 = 0;
  }
  else {
    p->wantToLock = p->wantToLock + 1;
    eLock = isWriteLock + 1;
    if (p->locked == '\0') {
      btreeLockCarefully(p);
    }
    iVar3 = querySharedCacheTableLock(p,iTab,eLock);
    if (iVar3 == 0) {
      pBVar2 = p->pBt;
      for (pBVar4 = pBVar2->pLock; pBVar4 != (BtLock *)0x0; pBVar4 = pBVar4->pNext) {
        if ((pBVar4->iTable == iTab) && (pBVar4->pBtree == p)) goto LAB_0015397d;
      }
      pBVar4 = (BtLock *)sqlite3Malloc(0x18);
      if (pBVar4 == (BtLock *)0x0) {
        iVar3 = 7;
      }
      else {
        pBVar4->pBtree = (Btree *)0x0;
        pBVar4->iTable = 0;
        pBVar4->eLock = '\0';
        *(undefined3 *)&pBVar4->field_0xd = 0;
        pBVar4->pNext = (BtLock *)0x0;
        pBVar4->iTable = iTab;
        pBVar4->pBtree = p;
        pBVar4->pNext = pBVar2->pLock;
        pBVar2->pLock = pBVar4;
LAB_0015397d:
        iVar3 = 0;
        if (pBVar4->eLock < eLock) {
          pBVar4->eLock = eLock;
        }
      }
    }
    if (p->sharable != '\0') {
      piVar1 = &p->wantToLock;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        unlockBtreeMutex(p);
      }
    }
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeLockTable(Btree *p, int iTab, u8 isWriteLock){
  int rc = SQLITE_OK;
  assert( p->inTrans!=TRANS_NONE );
  if( p->sharable ){
    u8 lockType = READ_LOCK + isWriteLock;
    assert( READ_LOCK+1==WRITE_LOCK );
    assert( isWriteLock==0 || isWriteLock==1 );

    sqlite3BtreeEnter(p);
    rc = querySharedCacheTableLock(p, iTab, lockType);
    if( rc==SQLITE_OK ){
      rc = setSharedCacheTableLock(p, iTab, lockType);
    }
    sqlite3BtreeLeave(p);
  }
  return rc;
}